

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pollable.c
# Opt level: O2

void nni_pollable_fini(nni_pollable *p)

{
  uint64_t uVar1;
  
  uVar1 = nni_atomic_get64(&p->p_fds);
  if (uVar1 != 0xffffffffffffffff) {
    nni_plat_pipe_close((int)(uVar1 >> 0x20),(int)uVar1);
    return;
  }
  return;
}

Assistant:

void
nni_pollable_fini(nni_pollable *p)
{
	uint64_t fds;

	fds = nni_atomic_get64(&p->p_fds);
	if (fds != (uint64_t) -1) {
		int rfd, wfd;
		// Read in the high order, write in the low order.
		rfd = RFD(fds);
		wfd = WFD(fds);
		nni_plat_pipe_close(rfd, wfd);
	}
}